

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal_ports.cpp
# Opt level: O1

void __thiscall sc_core::sc_in<bool>::remove_traces(sc_in<bool> *this)

{
  sc_trace_params_vec *psVar1;
  sc_trace_params *psVar2;
  pointer pcVar3;
  pointer ppsVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  psVar1 = this->m_traces;
  if (psVar1 != (sc_trace_params_vec *)0x0) {
    uVar6 = (int)((ulong)((long)(psVar1->
                                super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(psVar1->
                               super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
    if (-1 < (int)uVar6) {
      lVar7 = (ulong)uVar6 + 1;
      do {
        psVar2 = (this->m_traces->
                 super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[lVar7 + -1];
        if (psVar2 != (sc_trace_params *)0x0) {
          pcVar3 = (psVar2->name)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &(psVar2->name).field_2) {
            operator_delete(pcVar3);
          }
          operator_delete(psVar2);
        }
        lVar8 = lVar7 + -1;
        bVar5 = 0 < lVar7;
        lVar7 = lVar8;
      } while (lVar8 != 0 && bVar5);
    }
    psVar1 = this->m_traces;
    if (psVar1 != (sc_trace_params_vec *)0x0) {
      ppsVar4 = (psVar1->
                super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (ppsVar4 != (pointer)0x0) {
        operator_delete(ppsVar4);
      }
      operator_delete(psVar1);
    }
    this->m_traces = (sc_trace_params_vec *)0x0;
  }
  return;
}

Assistant:

void
sc_in<bool>::remove_traces() const
{
    if( m_traces != 0 ) {
	for( int i = m_traces->size() - 1; i >= 0; -- i ) {
	    delete (*m_traces)[i];
	}
	delete m_traces;
	m_traces = 0;
    }
}